

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O2

png_uint_32 png_check_keyword(png_structrp png_ptr,png_const_charp key,png_bytep new_key)

{
  bool bVar1;
  byte *pbVar2;
  uint uVar3;
  png_uint_32 pVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  png_warning_parameters p;
  
  if (key == (png_const_charp)0x0) {
    *new_key = '\0';
  }
  else {
    bVar1 = true;
    uVar3 = 0;
    uVar6 = 0;
    bVar7 = false;
    pbVar2 = (byte *)key;
    while( true ) {
      bVar8 = *pbVar2;
      if ((bVar8 == 0) || (0x4e < uVar3)) break;
      bVar9 = (byte)(bVar8 + 0x81) < 0xa2;
      bVar10 = bVar8 < 0xa1;
      bVar1 = bVar10 && bVar9;
      if (bVar10 && bVar9) {
        if (bVar7) {
          *new_key = 0x20;
          uVar5 = (uint)bVar8;
          if (bVar8 == 0x20) {
            uVar5 = uVar6;
          }
          goto LAB_00288863;
        }
        uVar5 = (uint)bVar8;
        if (uVar6 != 0) {
          uVar5 = uVar6;
        }
        uVar6 = uVar5;
        bVar1 = true;
        bVar7 = false;
        pbVar2 = pbVar2 + 1;
      }
      else {
        *new_key = bVar8;
        uVar5 = uVar6;
LAB_00288863:
        uVar6 = uVar5;
        bVar7 = !bVar10 || !bVar9;
        uVar3 = uVar3 + 1;
        new_key = new_key + 1;
        pbVar2 = pbVar2 + 1;
      }
    }
    bVar8 = uVar3 != 0 & bVar1;
    uVar5 = 0x20;
    if (uVar6 != 0) {
      uVar5 = uVar6;
    }
    if (bVar8 == 0) {
      uVar5 = uVar6;
    }
    new_key[-(ulong)bVar8] = 0;
    pVar4 = uVar3 - bVar8;
    if (pVar4 != 0) {
      if (*pbVar2 != 0) {
        png_warning(png_ptr,"keyword truncated");
        return pVar4;
      }
      if (uVar5 == 0) {
        return pVar4;
      }
      png_warning_parameter(p,1,key);
      png_warning_parameter_signed(p,2,4,uVar5);
      png_formatted_warning(png_ptr,p,"keyword \"@1\": bad character \'0x@2\'");
      return pVar4;
    }
  }
  return 0;
}

Assistant:

png_uint_32 /* PRIVATE */
png_check_keyword(png_structrp png_ptr, png_const_charp key, png_bytep new_key)
{
#ifdef PNG_WARNINGS_SUPPORTED
   png_const_charp orig_key = key;
#endif
   png_uint_32 key_len = 0;
   int bad_character = 0;
   int space = 1;

   png_debug(1, "in png_check_keyword");

   if (key == NULL)
   {
      *new_key = 0;
      return 0;
   }

   while (*key && key_len < 79)
   {
      png_byte ch = (png_byte)*key++;

      if ((ch > 32 && ch <= 126) || (ch >= 161 /*&& ch <= 255*/))
      {
         *new_key++ = ch; ++key_len; space = 0;
      }

      else if (space == 0)
      {
         /* A space or an invalid character when one wasn't seen immediately
          * before; output just a space.
          */
         *new_key++ = 32; ++key_len; space = 1;

         /* If the character was not a space then it is invalid. */
         if (ch != 32)
            bad_character = ch;
      }

      else if (bad_character == 0)
         bad_character = ch; /* just skip it, record the first error */
   }

   if (key_len > 0 && space != 0) /* trailing space */
   {
      --key_len; --new_key;
      if (bad_character == 0)
         bad_character = 32;
   }

   /* Terminate the keyword */
   *new_key = 0;

   if (key_len == 0)
      return 0;

#ifdef PNG_WARNINGS_SUPPORTED
   /* Try to only output one warning per keyword: */
   if (*key != 0) /* keyword too long */
      png_warning(png_ptr, "keyword truncated");

   else if (bad_character != 0)
   {
      PNG_WARNING_PARAMETERS(p)

      png_warning_parameter(p, 1, orig_key);
      png_warning_parameter_signed(p, 2, PNG_NUMBER_FORMAT_02x, bad_character);

      png_formatted_warning(png_ptr, p, "keyword \"@1\": bad character '0x@2'");
   }
#else /* !WARNINGS */
   PNG_UNUSED(png_ptr)
#endif /* !WARNINGS */

   return key_len;
}